

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall icu_63::ZNStringPool::ZNStringPool(ZNStringPool *this,UErrorCode *status)

{
  ZNStringPoolChunk *pZVar1;
  UHashtable *pUVar2;
  
  this->fChunks = (ZNStringPoolChunk *)0x0;
  this->fHash = (UHashtable *)0x0;
  if (U_ZERO_ERROR < *status) {
    return;
  }
  pZVar1 = (ZNStringPoolChunk *)UMemory::operator_new((UMemory *)0xfb0,(size_t)status);
  if (pZVar1 == (ZNStringPoolChunk *)0x0) {
    this->fChunks = (ZNStringPoolChunk *)0x0;
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    pZVar1->fNext = (ZNStringPoolChunk *)0x0;
    pZVar1->fLimit = 0;
    this->fChunks = pZVar1;
    pUVar2 = uhash_open_63(uhash_hashUChars_63,uhash_compareUChars_63,uhash_compareUChars_63,status)
    ;
    this->fHash = pUVar2;
  }
  return;
}

Assistant:

ZNStringPool::ZNStringPool(UErrorCode &status) {
    fChunks = NULL;
    fHash   = NULL;
    if (U_FAILURE(status)) {
        return;
    }
    fChunks = new ZNStringPoolChunk;
    if (fChunks == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    fHash   = uhash_open(uhash_hashUChars      /* keyHash */, 
                         uhash_compareUChars   /* keyComp */, 
                         uhash_compareUChars   /* valueComp */, 
                         &status);
    if (U_FAILURE(status)) {
        return;
    }
}